

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

void __thiscall
glslang::TBuiltInIdTraverser::visitSymbol(TBuiltInIdTraverser *this,TIntermSymbol *symbol)

{
  TIdMaps *pTVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TString *__k;
  mapped_type_conflict1 *pmVar5;
  uint extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar6;
  ulong uVar7;
  
  iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar2));
  if ((*(ushort *)(lVar4 + 8) & 0xff80) != 0) {
    iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar4 = 3;
    if ((*(char *)(CONCAT44(extraout_var_00,iVar2) + 8) == '\x10') &&
       (uVar3 = (*(uint *)(CONCAT44(extraout_var_00,iVar2) + 0x18) & 0x7f) - 3, uVar3 < 4)) {
      lVar4 = *(long *)(&DAT_0084dc68 + (ulong)uVar3 * 8);
    }
    iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
    pTVar1 = this->idMaps;
    __k = getNameForIdMap_abi_cxx11_(symbol);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
             ::operator[](&pTVar1->maps[lVar4].
                           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
                          ,__k);
    *pmVar5 = CONCAT44(extraout_var_01,iVar2);
  }
  (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
  uVar7 = this->idShift & 0xffffffffffffff;
  iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
  uVar6 = CONCAT44(extraout_var_03,iVar2) & 0xffffffffffffff;
  if (uVar6 < uVar7) {
    uVar6 = uVar7;
  }
  this->idShift = uVar6 | ((ulong)extraout_var_02 & 0xff000000) << 0x20;
  return;
}

Assistant:

virtual void visitSymbol(TIntermSymbol* symbol)
    {
        const TQualifier& qualifier = symbol->getType().getQualifier();
        if (qualifier.builtIn != EbvNone) {
            TShaderInterface si = symbol->getType().getShaderInterface();
            idMaps[si][getNameForIdMap(symbol)] = symbol->getId();
        }
        idShift = (symbol->getId() & ~TSymbolTable::uniqueIdMask) |
                std::max(idShift & TSymbolTable::uniqueIdMask,
                         symbol->getId() & TSymbolTable::uniqueIdMask);
    }